

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall
doctest::anon_unknown_14::JUnitReporter::test_case_reenter(JUnitReporter *this,TestCaseData *in)

{
  undefined8 uVar1;
  double dVar2;
  vector<doctest::String,_std::allocator<doctest::String>_> nameStack;
  char *pcVar3;
  TestCaseData *file;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 in_ZMM0 [64];
  timeval t;
  undefined8 in_stack_ffffffffffffff78;
  _Alloc_hider in_stack_ffffffffffffff80;
  pointer in_stack_ffffffffffffff88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  string local_60;
  vector<doctest::String,_std::allocator<doctest::String>_> local_40;
  
  auVar4 = in_ZMM0._0_16_;
  gettimeofday((timeval *)&stack0xffffffffffffff80,(__timezone_ptr_t)0x0);
  auVar4 = vcvtusi2sd_avx512f(auVar4,(long)in_stack_ffffffffffffff88 +
                                     ((long)in_stack_ffffffffffffff80._M_p * 1000000 -
                                     (this->timer).m_ticks));
  auVar5._0_8_ = auVar4._0_8_ / 1000000.0;
  auVar5._8_8_ = auVar4._8_8_;
  uVar1 = vcmpsd_avx512f(auVar5,ZEXT816(0x3f1a36e2eb1c432d),1);
  dVar2 = (double)((ulong)!(bool)((byte)uVar1 & 1) * (long)auVar5._0_8_);
  (this->testCaseData).testcases.
  super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1].time = dVar2;
  (this->testCaseData).totalSeconds = dVar2 + (this->testCaseData).totalSeconds;
  std::vector<doctest::String,_std::allocator<doctest::String>_>::vector
            (&local_40,&this->deepestSubcaseStackNames);
  nameStack.super__Vector_base<doctest::String,_std::allocator<doctest::String>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffff80._M_p;
  nameStack.super__Vector_base<doctest::String,_std::allocator<doctest::String>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffff78;
  nameStack.super__Vector_base<doctest::String,_std::allocator<doctest::String>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffff88;
  JUnitTestCaseData::appendSubcaseNamesToLastTestcase(&this->testCaseData,nameStack);
  std::vector<doctest::String,_std::allocator<doctest::String>_>::~vector(&local_40);
  std::vector<doctest::String,_std::allocator<doctest::String>_>::_M_erase_at_end
            (&this->deepestSubcaseStackNames,
             (this->deepestSubcaseStackNames).
             super__Vector_base<doctest::String,_std::allocator<doctest::String>_>._M_impl.
             super__Vector_impl_data._M_start);
  gettimeofday((timeval *)&stack0xffffffffffffff80,(__timezone_ptr_t)0x0);
  (this->timer).m_ticks =
       (long)in_stack_ffffffffffffff80._M_p * 1000000 + (long)in_stack_ffffffffffffff88;
  file = in;
  if ((in->m_file).field_0.buf[0x17] < '\0') {
    file = (TestCaseData *)(in->m_file).field_0.data.ptr;
  }
  pcVar3 = skipPathFromFilename((char *)file);
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff80,pcVar3,(allocator *)&stack0xffffffffffffff7f);
  std::__cxx11::string::string((string *)&local_60,in->m_name,(allocator *)&stack0xffffffffffffff7e)
  ;
  JUnitTestCaseData::add(&this->testCaseData,(string *)&stack0xffffffffffffff80,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_ffffffffffffff80._M_p != &local_70) {
    operator_delete(in_stack_ffffffffffffff80._M_p,local_70._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void test_case_reenter(const TestCaseData& in) override {
            testCaseData.addTime(timer.getElapsedSeconds());
            testCaseData.appendSubcaseNamesToLastTestcase(deepestSubcaseStackNames);
            deepestSubcaseStackNames.clear();

            timer.start();
            testCaseData.add(skipPathFromFilename(in.m_file.c_str()), in.m_name);
        }